

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pipeline.hpp
# Opt level: O3

void __thiscall
tf::
DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:160:59)>_>
::_on_pipe(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
           *this,Pipeflow *pf,Runtime *param_2)

{
  size_t *psVar1;
  size_t sVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  code *pcVar4;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  bool bVar5;
  char extraout_AL_03;
  int iVar6;
  variant_alternative_t<0UL,_variant<int,_monostate>_> *rhs;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar7;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  ResultBuilder DOCTEST_RB;
  Result local_e0;
  ResultBuilder local_c0;
  Expression_lhs<const_unsigned_long_&> local_48;
  size_t local_38;
  
  if (pf->_pipe == 1) {
    rhs = std::get<0ul,int,std::monostate>
                    (&(this->_buffer).
                      super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0xa1;
    local_c0.super_AssertData.m_expr = "j2 < N";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_48.lhs = (this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
                   .
                   super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
                   .
                   super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>,_false>
                   ._M_head_impl._callable.j2;
    local_48.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_e0,&local_48,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
                .
                super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
                .
                super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>,_false>
                ._M_head_impl._callable.N);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar7 = extraout_XMM0_Qa;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar7 = extraout_XMM0_Qa_00;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar7);
    if (extraout_AL != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_c0.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0xa2;
    local_c0.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_48.lhs = (unsigned_long *)
                   (pf->_token %
                   (this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
                   .
                   super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
                   .
                   super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>,_false>
                   ._M_head_impl._callable.L);
    local_48.m_at = DT_REQUIRE;
    local_38 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_48,&local_38);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar7 = extraout_XMM0_Qa_01;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar7 = extraout_XMM0_Qa_02;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar7);
    if (extraout_AL_00 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_c0.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0xa5;
    local_c0.super_AssertData.m_expr = "source[j2++] + 1 == input";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    pvVar3 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
             .
             super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
             .
             super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>,_false>
             ._M_head_impl._callable.source;
    psVar1 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
             .
             super__Tuple_impl<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
             .
             super__Head_base<1UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>,_false>
             ._M_head_impl._callable.j2;
    sVar2 = *psVar1;
    *psVar1 = sVar2 + 1;
    local_48.lhs = (unsigned_long *)
                   ((ulong)((pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[sVar2] + 1) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_e0,(Expression_lhs<const_int> *)&local_48,rhs);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar7 = extraout_XMM0_Qa_03;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar7 = extraout_XMM0_Qa_04;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar7);
    if (extraout_AL_01 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_c0.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
  }
  else if (pf->_pipe == 0) {
    psVar1 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
             .
             super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_false>
             ._M_head_impl._callable.j1;
    sVar2 = *psVar1;
    if (sVar2 == (this->_pipes).
                 super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
                 .
                 super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_false>
                 ._M_head_impl._callable.N) {
      pf->_stop = true;
      iVar6 = 0;
    }
    else {
      local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_c0.super_AssertData.m_at = DT_REQUIRE;
      local_c0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_c0.super_AssertData.m_line = 0x99;
      local_c0.super_AssertData.m_expr = "j1 == source[j1]";
      local_c0.super_AssertData.m_failed = true;
      local_c0.super_AssertData.m_threw = false;
      local_c0.super_AssertData.m_threw_as = false;
      local_c0.super_AssertData.m_exception_type = "";
      local_c0.super_AssertData.m_exception_string = "";
      local_48.m_at = DT_REQUIRE;
      local_48.lhs = psVar1;
      doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<int,_nullptr>
                (&local_e0,&local_48,
                 (((this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
                   .
                   super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_false>
                   ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>).
                 _M_impl.super__Vector_impl_data._M_start + sVar2);
      doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
      local_c0.super_AssertData._40_2_ =
           CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
      dVar7 = extraout_XMM0_Qa_05;
      if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_e0.m_decomp.field_0.data.ptr);
        dVar7 = extraout_XMM0_Qa_06;
      }
      doctest::detail::ResultBuilder::log(&local_c0,dVar7);
      if (extraout_AL_02 != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      if (local_c0.super_AssertData.m_failed == true) {
        bVar5 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at);
        if (bVar5) {
          doctest::detail::throwException();
        }
      }
      if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                           local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_c0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                           local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                           local_c0.super_AssertData.m_exception.field_0.buf[0]));
      }
      local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_c0.super_AssertData.m_at = DT_REQUIRE;
      local_c0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_c0.super_AssertData.m_line = 0x9a;
      local_c0.super_AssertData.m_expr = "pf.token() % L == pf.line()";
      local_c0.super_AssertData.m_failed = true;
      local_c0.super_AssertData.m_threw = false;
      local_c0.super_AssertData.m_threw_as = false;
      local_c0.super_AssertData.m_exception_type = "";
      local_c0.super_AssertData.m_exception_string = "";
      local_48.lhs = (unsigned_long *)
                     (pf->_token %
                     (this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
                     .
                     super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_false>
                     ._M_head_impl._callable.L);
      local_48.m_at = DT_REQUIRE;
      local_38 = pf->_line;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_48,&local_38);
      doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
      local_c0.super_AssertData._40_2_ =
           CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
      dVar7 = extraout_XMM0_Qa_07;
      if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_e0.m_decomp.field_0.data.ptr);
        dVar7 = extraout_XMM0_Qa_08;
      }
      doctest::detail::ResultBuilder::log(&local_c0,dVar7);
      if (extraout_AL_03 != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      if (local_c0.super_AssertData.m_failed == true) {
        bVar5 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at);
        if (bVar5) {
          doctest::detail::throwException();
        }
      }
      if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                           local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_c0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                           local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                           local_c0.super_AssertData.m_exception.field_0.buf[0]));
      }
      pvVar3 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_false>
               ._M_head_impl._callable.source;
      psVar1 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:160:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:148:68)>,_false>
               ._M_head_impl._callable.j1;
      sVar2 = *psVar1;
      *psVar1 = sVar2 + 1;
      iVar6 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[sVar2] + 1;
    }
    local_c0.super_AssertData.m_test_case =
         (TestCaseData *)CONCAT44(local_c0.super_AssertData.m_test_case._4_4_,iVar6);
    std::variant<int,std::monostate>::operator=
              ((variant<int,std::monostate> *)
               ((this->_buffer).
                super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + pf->_line),(int *)&local_c0);
  }
  return;
}

Assistant:

void DataPipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime&) {

  visit_tuple([&](auto&& pipe){

    using data_pipe_t = std::decay_t<decltype(pipe)>;
    using callable_t  = typename data_pipe_t::callable_t;
    using input_t     = std::decay_t<typename data_pipe_t::input_t>;
    using output_t    = std::decay_t<typename data_pipe_t::output_t>;
    
    // first pipe
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      // [](tf::Pipeflow&) -> void {}, i.e., we only have one pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(pf);
      // [](tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(pf);
      }
    }
    // other pipes without pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, std::add_lvalue_reference_t<input_t> >) {
      // [](input_t&) -> void {}, i.e., the last pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data));
      // [](input_t&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data)
        );
      }
    }
    // other pipes with pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, input_t&, Pipeflow&>) {
      // [](input_t&, tf::Pipeflow&) -> void {}
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data), pf);
      // [](input_t&, tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data), pf
        );
      }
    }
    //else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
    //  pipe._callable(pf, rt);
    //}
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}